

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O1

void aom_highbd_lpf_vertical_8_sse2
               (uint16_t *s,int p,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  uint16_t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  uint16_t uVar29;
  uint16_t uVar30;
  uint16_t uVar31;
  uint16_t uVar32;
  uint16_t uVar33;
  uint16_t uVar34;
  uint16_t uVar35;
  uint16_t uVar36;
  uint16_t uVar37;
  uint16_t uVar38;
  uint16_t uVar39;
  uint16_t uVar40;
  uint16_t uVar41;
  uint16_t uVar42;
  uint16_t uVar43;
  uint16_t uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  long lVar61;
  long lVar62;
  short sVar63;
  short sVar66;
  short sVar67;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  short sVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  short sVar80;
  undefined4 uVar81;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  short sVar79;
  short sVar82;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  short sVar91;
  short sVar97;
  short sVar98;
  undefined1 auVar96 [16];
  undefined4 uVar99;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  ushort uVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  ushort uVar133;
  short sVar134;
  short sVar135;
  short sVar136;
  ushort uVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  ushort uVar141;
  short sVar142;
  short sVar143;
  short sVar144;
  short sVar145;
  ushort uVar146;
  ushort uVar147;
  ushort uVar148;
  undefined1 auVar127 [16];
  ushort uVar149;
  undefined1 auVar128 [16];
  short sVar150;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  short sVar161;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  short sVar162;
  undefined1 auVar160 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 local_a8 [16];
  undefined8 local_98 [2];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined8 uStack_80;
  undefined8 local_78;
  ulong uStack_70;
  ulong uStack_68;
  __m128i pq [4];
  undefined1 auVar73 [12];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar100 [12];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar101 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  
  auVar110 = *(undefined1 (*) [16])(s + -4);
  puVar1 = s + (long)p + -4;
  uVar29 = *puVar1;
  uVar30 = puVar1[1];
  uVar31 = puVar1[2];
  uVar32 = puVar1[3];
  uVar33 = puVar1[4];
  uVar34 = puVar1[5];
  uVar35 = puVar1[6];
  uVar36 = puVar1[7];
  auVar75 = *(undefined1 (*) [16])(s + (long)(p * 2) + -4);
  lVar62 = (long)(p * 3);
  puVar1 = s + lVar62 + -4;
  uVar37 = *puVar1;
  uVar38 = puVar1[1];
  uVar39 = puVar1[2];
  uVar40 = puVar1[3];
  uVar41 = puVar1[4];
  uVar42 = puVar1[5];
  uVar43 = puVar1[6];
  uVar44 = puVar1[7];
  sVar144 = auVar110._6_2_;
  auVar95._0_12_ = auVar110._0_12_;
  auVar95._12_2_ = sVar144;
  auVar95._14_2_ = uVar32;
  auVar94._12_4_ = auVar95._12_4_;
  auVar94._0_10_ = auVar110._0_10_;
  auVar94._10_2_ = uVar31;
  sVar98 = auVar110._4_2_;
  auVar93._10_6_ = auVar94._10_6_;
  auVar93._0_8_ = auVar110._0_8_;
  auVar93._8_2_ = sVar98;
  auVar48._4_8_ = auVar93._8_8_;
  auVar48._2_2_ = uVar30;
  sVar97 = auVar110._2_2_;
  auVar48._0_2_ = sVar97;
  sVar91 = auVar110._0_2_;
  auVar92._0_4_ = CONCAT22(uVar29,sVar91);
  auVar92._4_12_ = auVar48;
  sVar136 = auVar75._6_2_;
  auVar152._0_12_ = auVar75._0_12_;
  auVar152._12_2_ = sVar136;
  auVar152._14_2_ = uVar40;
  auVar127._12_4_ = auVar152._12_4_;
  auVar127._0_10_ = auVar75._0_10_;
  auVar127._10_2_ = uVar39;
  sVar67 = auVar75._4_2_;
  auVar115._10_6_ = auVar127._10_6_;
  auVar115._0_8_ = auVar75._0_8_;
  auVar115._8_2_ = sVar67;
  auVar49._4_8_ = auVar115._8_8_;
  auVar49._2_2_ = uVar38;
  sVar66 = auVar75._2_2_;
  auVar49._0_2_ = sVar66;
  sVar63 = auVar75._0_2_;
  auVar114._0_8_ = auVar92._0_8_;
  auVar114._8_4_ = auVar48._0_4_;
  auVar114._12_4_ = auVar49._0_4_;
  local_78 = auVar114._8_8_;
  auVar120._0_8_ = CONCAT44(CONCAT22(uVar37,sVar63),auVar92._0_4_);
  local_88 = auVar93._8_4_;
  uStack_84 = auVar115._8_4_;
  sVar106 = auVar110._8_2_;
  uVar99 = CONCAT22(uVar33,sVar106);
  sVar107 = auVar110._10_2_;
  auVar100._0_8_ = CONCAT26(uVar34,CONCAT24(sVar107,uVar99));
  sVar108 = auVar110._12_2_;
  auVar100._8_2_ = sVar108;
  auVar100._10_2_ = uVar35;
  sVar109 = auVar110._14_2_;
  auVar101._12_2_ = sVar109;
  auVar101._0_12_ = auVar100;
  auVar101._14_2_ = uVar36;
  sVar83 = auVar75._8_2_;
  uVar71 = CONCAT22(uVar41,sVar83);
  sVar84 = auVar75._10_2_;
  auVar73._0_8_ = CONCAT26(uVar42,CONCAT24(sVar84,uVar71));
  sVar85 = auVar75._12_2_;
  auVar73._8_2_ = sVar85;
  auVar73._10_2_ = uVar43;
  sVar86 = auVar75._14_2_;
  auVar164._12_2_ = sVar86;
  auVar164._0_12_ = auVar73;
  auVar164._14_2_ = uVar44;
  auVar154._8_4_ = (int)((ulong)auVar100._0_8_ >> 0x20);
  auVar154._0_8_ = auVar100._0_8_;
  auVar154._12_4_ = (int)((ulong)auVar73._0_8_ >> 0x20);
  auVar69._8_8_ = auVar154._8_8_;
  auVar69._4_4_ = uVar71;
  auVar69._0_4_ = uVar99;
  auVar102._0_8_ = CONCAT44(auVar73._8_4_,auVar100._8_4_);
  auVar102._8_4_ = auVar101._12_4_;
  auVar102._12_4_ = auVar164._12_4_;
  uStack_80 = auVar69._8_8_;
  uStack_70 = auVar102._0_8_;
  uStack_68 = auVar120._0_8_;
  pq[0][0] = auVar102._8_8_;
  auVar110 = *(undefined1 (*) [16])blimit;
  auVar12[0xd] = 0;
  auVar12._0_13_ = auVar110._0_13_;
  auVar12[0xe] = auVar110[7];
  auVar15[0xc] = auVar110[6];
  auVar15._0_12_ = auVar110._0_12_;
  auVar15._13_2_ = auVar12._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar110._0_11_;
  auVar18._12_3_ = auVar15._12_3_;
  auVar21[10] = auVar110[5];
  auVar21._0_10_ = auVar110._0_10_;
  auVar21._11_4_ = auVar18._11_4_;
  auVar24[9] = 0;
  auVar24._0_9_ = auVar110._0_9_;
  auVar24._10_5_ = auVar21._10_5_;
  auVar27[8] = auVar110[4];
  auVar27._0_8_ = auVar110._0_8_;
  auVar27._9_6_ = auVar24._9_6_;
  auVar50._7_8_ = 0;
  auVar50._0_7_ = auVar27._8_7_;
  auVar55._1_8_ = SUB158(auVar50 << 0x40,7);
  auVar55[0] = auVar110[3];
  auVar55._9_6_ = 0;
  auVar56._1_10_ = SUB1510(auVar55 << 0x30,5);
  auVar56[0] = auVar110[2];
  auVar56._11_4_ = 0;
  auVar74._3_12_ = SUB1512(auVar56 << 0x20,3);
  auVar74[2] = auVar110[1];
  auVar74[0] = auVar110[0];
  auVar74[1] = 0;
  auVar74[0xf] = 0;
  auVar152 = ZEXT416(bd - 8);
  auVar75 = psllw(auVar74,auVar152);
  auVar110 = *(undefined1 (*) [16])limit;
  auVar10[0xd] = 0;
  auVar10._0_13_ = auVar110._0_13_;
  auVar10[0xe] = auVar110[7];
  auVar13[0xc] = auVar110[6];
  auVar13._0_12_ = auVar110._0_12_;
  auVar13._13_2_ = auVar10._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = auVar110._0_11_;
  auVar16._12_3_ = auVar13._12_3_;
  auVar19[10] = auVar110[5];
  auVar19._0_10_ = auVar110._0_10_;
  auVar19._11_4_ = auVar16._11_4_;
  auVar22[9] = 0;
  auVar22._0_9_ = auVar110._0_9_;
  auVar22._10_5_ = auVar19._10_5_;
  auVar25[8] = auVar110[4];
  auVar25._0_8_ = auVar110._0_8_;
  auVar25._9_6_ = auVar22._9_6_;
  auVar51._7_8_ = 0;
  auVar51._0_7_ = auVar25._8_7_;
  auVar57._1_8_ = SUB158(auVar51 << 0x40,7);
  auVar57[0] = auVar110[3];
  auVar57._9_6_ = 0;
  auVar58._1_10_ = SUB1510(auVar57 << 0x30,5);
  auVar58[0] = auVar110[2];
  auVar58._11_4_ = 0;
  auVar28[2] = auVar110[1];
  auVar28._0_2_ = auVar110._0_2_;
  auVar28._3_12_ = SUB1512(auVar58 << 0x20,3);
  auVar153._0_2_ = auVar110._0_2_ & 0xff;
  auVar153._2_13_ = auVar28._2_13_;
  auVar153[0xf] = 0;
  auVar154 = psllw(auVar153,auVar152);
  auVar110 = *(undefined1 (*) [16])thresh;
  auVar11[0xd] = 0;
  auVar11._0_13_ = auVar110._0_13_;
  auVar11[0xe] = auVar110[7];
  auVar14[0xc] = auVar110[6];
  auVar14._0_12_ = auVar110._0_12_;
  auVar14._13_2_ = auVar11._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar110._0_11_;
  auVar17._12_3_ = auVar14._12_3_;
  auVar20[10] = auVar110[5];
  auVar20._0_10_ = auVar110._0_10_;
  auVar20._11_4_ = auVar17._11_4_;
  auVar23[9] = 0;
  auVar23._0_9_ = auVar110._0_9_;
  auVar23._10_5_ = auVar20._10_5_;
  auVar26[8] = auVar110[4];
  auVar26._0_8_ = auVar110._0_8_;
  auVar26._9_6_ = auVar23._9_6_;
  auVar52._7_8_ = 0;
  auVar52._0_7_ = auVar26._8_7_;
  auVar59._1_8_ = SUB158(auVar52 << 0x40,7);
  auVar59[0] = auVar110[3];
  auVar59._9_6_ = 0;
  auVar60._1_10_ = SUB1510(auVar59 << 0x30,5);
  auVar60[0] = auVar110[2];
  auVar60._11_4_ = 0;
  auVar87._3_12_ = SUB1512(auVar60 << 0x20,3);
  auVar87[2] = auVar110[1];
  auVar87[0] = auVar110[0];
  auVar87[1] = 0;
  auVar87[0xf] = 0;
  auVar151._4_4_ = auVar127._12_4_;
  auVar151._0_4_ = auVar94._12_4_;
  auVar151._8_4_ = local_88;
  auVar151._12_4_ = uStack_84;
  auVar110 = psubusw(auVar151,auVar69);
  auVar115 = psubusw(auVar69,auVar151);
  auVar115 = auVar115 | auVar110;
  auVar110 = paddusw(auVar115,auVar115);
  auVar111._0_8_ = auVar110._0_8_;
  auVar111._8_8_ = 0;
  auVar116._0_2_ = auVar115._8_2_ >> 1;
  auVar116._2_2_ = auVar115._10_2_ >> 1;
  auVar116._4_2_ = auVar115._12_2_ >> 1;
  auVar116._6_2_ = auVar115._14_2_ >> 1;
  auVar116._8_8_ = 0;
  auVar110 = paddusw(auVar116,auVar111);
  auVar110 = auVar110 ^ _DAT_004db440;
  auVar75 = auVar75 ^ _DAT_004db440;
  auVar117._0_2_ = -(ushort)(auVar75._0_2_ < auVar110._0_2_);
  auVar117._2_2_ = -(ushort)(auVar75._2_2_ < auVar110._2_2_);
  auVar117._4_2_ = -(ushort)(auVar75._4_2_ < auVar110._4_2_);
  auVar117._6_2_ = -(ushort)(auVar75._6_2_ < auVar110._6_2_);
  auVar117._8_2_ = -(ushort)(auVar75._8_2_ < auVar110._8_2_);
  auVar117._10_2_ = -(ushort)(auVar75._10_2_ < auVar110._10_2_);
  auVar117._12_2_ = -(ushort)(auVar75._12_2_ < auVar110._12_2_);
  auVar117._14_2_ = -(ushort)(auVar75._14_2_ < auVar110._14_2_);
  auVar127 = paddusw(_DAT_00515e00,auVar154);
  auVar127 = auVar127 & auVar117;
  auVar110._8_4_ = uVar99;
  auVar110._0_8_ = local_98[0];
  auVar110._12_4_ = uVar71;
  auVar75._4_4_ = uStack_84;
  auVar75._0_4_ = local_88;
  auVar75._8_8_ = auVar69._8_8_;
  auVar115 = psubusw(auVar110,auVar75);
  auVar75 = psubusw(auVar75,auVar110);
  auVar110 = psllw(auVar87,auVar152);
  auVar75 = auVar75 | auVar115;
  sVar125 = auVar75._0_2_;
  sVar139 = auVar75._8_2_;
  auVar76._0_2_ = (ushort)(sVar139 < sVar125) * sVar125 | (ushort)(sVar139 >= sVar125) * sVar139;
  sVar126 = auVar75._2_2_;
  sVar138 = auVar75._10_2_;
  auVar76._2_2_ = (ushort)(sVar138 < sVar126) * sVar126 | (ushort)(sVar138 >= sVar126) * sVar138;
  sVar135 = auVar75._4_2_;
  sVar140 = auVar75._12_2_;
  auVar76._4_2_ = (ushort)(sVar140 < sVar135) * sVar135 | (ushort)(sVar140 >= sVar135) * sVar140;
  sVar134 = auVar75._6_2_;
  sVar143 = auVar75._14_2_;
  auVar76._6_2_ = (ushort)(sVar143 < sVar134) * sVar134 | (ushort)(sVar143 >= sVar134) * sVar143;
  sVar82 = (ushort)(0 < sVar139) * sVar139;
  auVar76._8_2_ = sVar82;
  sVar70 = (ushort)(0 < sVar138) * sVar138;
  auVar76._10_2_ = sVar70;
  sVar79 = (ushort)(0 < sVar140) * sVar140;
  auVar76._12_2_ = sVar79;
  sVar80 = (ushort)(0 < sVar143) * sVar143;
  auVar76._14_2_ = sVar80;
  sVar142 = auVar127._0_2_;
  uVar123 = (sVar142 < (short)auVar76._0_2_) * auVar76._0_2_ |
            (ushort)(sVar142 >= (short)auVar76._0_2_) * sVar142;
  sVar142 = auVar127._2_2_;
  uVar133 = (sVar142 < (short)auVar76._2_2_) * auVar76._2_2_ |
            (ushort)(sVar142 >= (short)auVar76._2_2_) * sVar142;
  sVar142 = auVar127._4_2_;
  uVar137 = (sVar142 < (short)auVar76._4_2_) * auVar76._4_2_ |
            (ushort)(sVar142 >= (short)auVar76._4_2_) * sVar142;
  sVar142 = auVar127._6_2_;
  uVar141 = (sVar142 < (short)auVar76._6_2_) * auVar76._6_2_ |
            (ushort)(sVar142 >= (short)auVar76._6_2_) * sVar142;
  sVar142 = auVar127._8_2_;
  uVar146 = (ushort)(sVar142 < sVar82) * sVar82 | (ushort)(sVar142 >= sVar82) * sVar142;
  sVar82 = auVar127._10_2_;
  uVar147 = (ushort)(sVar82 < sVar70) * sVar70 | (ushort)(sVar82 >= sVar70) * sVar82;
  sVar70 = auVar127._12_2_;
  sVar82 = auVar127._14_2_;
  uVar148 = (ushort)(sVar70 < sVar79) * sVar79 | (ushort)(sVar70 >= sVar79) * sVar70;
  uVar149 = (ushort)(sVar82 < sVar80) * sVar80 | (ushort)(sVar82 >= sVar80) * sVar82;
  auVar76 = auVar76 ^ _DAT_004db440;
  auVar110 = auVar110 ^ _DAT_004db440;
  uVar72 = CONCAT22(-(ushort)(auVar110._2_2_ < auVar76._2_2_),
                    -(ushort)(auVar110._0_2_ < auVar76._0_2_));
  lVar61 = 0x20;
  auVar75 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  do {
    auVar127 = psubusw(*(undefined1 (*) [16])((long)local_98 + lVar61),
                       *(undefined1 (*) [16])(local_a8 + lVar61));
    auVar115 = psubusw(*(undefined1 (*) [16])(local_a8 + lVar61),
                       *(undefined1 (*) [16])((long)local_98 + lVar61));
    auVar115 = auVar115 | auVar127;
    sVar70 = auVar115._0_2_;
    uVar123 = (ushort)((short)uVar123 < sVar70) * sVar70 | ((short)uVar123 >= sVar70) * uVar123;
    sVar70 = auVar115._2_2_;
    uVar133 = (ushort)((short)uVar133 < sVar70) * sVar70 | ((short)uVar133 >= sVar70) * uVar133;
    sVar70 = auVar115._4_2_;
    uVar137 = (ushort)((short)uVar137 < sVar70) * sVar70 | ((short)uVar137 >= sVar70) * uVar137;
    sVar70 = auVar115._6_2_;
    uVar141 = (ushort)((short)uVar141 < sVar70) * sVar70 | ((short)uVar141 >= sVar70) * uVar141;
    sVar70 = auVar115._8_2_;
    uVar146 = (ushort)((short)uVar146 < sVar70) * sVar70 | ((short)uVar146 >= sVar70) * uVar146;
    sVar70 = auVar115._10_2_;
    uVar147 = (ushort)((short)uVar147 < sVar70) * sVar70 | ((short)uVar147 >= sVar70) * uVar147;
    sVar70 = auVar115._12_2_;
    uVar148 = (ushort)((short)uVar148 < sVar70) * sVar70 | ((short)uVar148 >= sVar70) * uVar148;
    sVar70 = auVar115._14_2_;
    uVar149 = (ushort)((short)uVar149 < sVar70) * sVar70 | ((short)uVar149 >= sVar70) * uVar149;
    lVar61 = lVar61 + 0x10;
  } while (lVar61 != 0x40);
  auVar75 = pshuflw(auVar75,auVar75,0);
  uVar81 = auVar75._0_4_;
  auVar112._4_4_ = uVar81;
  auVar112._0_4_ = uVar81;
  auVar112._8_4_ = uVar81;
  auVar112._12_4_ = uVar81;
  uVar81 = (undefined4)
           (CONCAT26(-(ushort)(auVar110._6_2_ < auVar76._6_2_),
                     CONCAT24(-(ushort)(auVar110._4_2_ < auVar76._4_2_),uVar72)) >> 0x20);
  auVar118._4_4_ = uVar81;
  auVar118._0_4_ = uVar72;
  auVar118._8_4_ = uVar72;
  auVar118._12_4_ = uVar81;
  auVar163._0_2_ =
       ((short)uVar146 < (short)uVar123) * uVar123 | ((short)uVar146 >= (short)uVar123) * uVar146;
  auVar163._2_2_ =
       ((short)uVar147 < (short)uVar133) * uVar133 | ((short)uVar147 >= (short)uVar133) * uVar147;
  auVar163._4_2_ =
       ((short)uVar148 < (short)uVar137) * uVar137 | ((short)uVar148 >= (short)uVar137) * uVar148;
  auVar163._6_2_ =
       ((short)uVar149 < (short)uVar141) * uVar141 | ((short)uVar149 >= (short)uVar141) * uVar149;
  auVar163._8_2_ = (0 < (short)uVar146) * uVar146;
  auVar163._10_2_ = (0 < (short)uVar147) * uVar147;
  auVar163._12_2_ = (0 < (short)uVar148) * uVar148;
  auVar163._14_2_ = (0 < (short)uVar149) * uVar149;
  auVar164 = psubusw(auVar163,auVar154);
  auVar110 = psllw(_DAT_00515e00,ZEXT416((uint)bd));
  auVar128._8_4_ = 0xffffffff;
  auVar128._0_8_ = 0xffffffffffffffff;
  auVar128._12_4_ = 0xffffffff;
  auVar110 = paddsw(auVar110,auVar128);
  auVar110 = psubsw(auVar110,auVar112);
  auVar115 = psubsw((undefined1  [16])0x0,auVar112);
  auVar75 = psubsw(auVar151,auVar112);
  auVar127 = psubsw(auVar69,auVar112);
  auVar154 = psubsw(auVar75,auVar127);
  sVar161 = auVar110._0_2_;
  sVar70 = auVar154._0_2_;
  uVar123 = (ushort)(sVar161 < sVar70) * sVar161 | (ushort)(sVar161 >= sVar70) * sVar70;
  sVar162 = auVar110._2_2_;
  sVar70 = auVar154._2_2_;
  uVar133 = (ushort)(sVar162 < sVar70) * sVar162 | (ushort)(sVar162 >= sVar70) * sVar70;
  sVar4 = auVar110._4_2_;
  sVar70 = auVar154._4_2_;
  uVar137 = (ushort)(sVar4 < sVar70) * sVar4 | (ushort)(sVar4 >= sVar70) * sVar70;
  sVar5 = auVar110._6_2_;
  sVar70 = auVar154._6_2_;
  uVar141 = (ushort)(sVar5 < sVar70) * sVar5 | (ushort)(sVar5 >= sVar70) * sVar70;
  sVar6 = auVar110._8_2_;
  sVar70 = auVar154._8_2_;
  uVar146 = (ushort)(sVar6 < sVar70) * sVar6 | (ushort)(sVar6 >= sVar70) * sVar70;
  sVar7 = auVar110._10_2_;
  sVar70 = auVar154._10_2_;
  uVar147 = (ushort)(sVar7 < sVar70) * sVar7 | (ushort)(sVar7 >= sVar70) * sVar70;
  sVar8 = auVar110._12_2_;
  sVar70 = auVar154._12_2_;
  sVar79 = auVar154._14_2_;
  uVar148 = (ushort)(sVar8 < sVar70) * sVar8 | (ushort)(sVar8 >= sVar70) * sVar70;
  sVar9 = auVar110._14_2_;
  uVar149 = (ushort)(sVar9 < sVar79) * sVar9 | (ushort)(sVar9 >= sVar79) * sVar79;
  sVar70 = auVar115._0_2_;
  auVar156._0_2_ = (ushort)((short)uVar123 < sVar70) * sVar70 | ((short)uVar123 >= sVar70) * uVar123
  ;
  sVar79 = auVar115._2_2_;
  auVar156._2_2_ = (ushort)((short)uVar133 < sVar79) * sVar79 | ((short)uVar133 >= sVar79) * uVar133
  ;
  sVar80 = auVar115._4_2_;
  auVar156._4_2_ = (ushort)((short)uVar137 < sVar80) * sVar80 | ((short)uVar137 >= sVar80) * uVar137
  ;
  sVar82 = auVar115._6_2_;
  auVar156._6_2_ = (ushort)((short)uVar141 < sVar82) * sVar82 | ((short)uVar141 >= sVar82) * uVar141
  ;
  sVar142 = auVar115._8_2_;
  auVar156._8_2_ =
       (ushort)((short)uVar146 < sVar142) * sVar142 | ((short)uVar146 >= sVar142) * uVar146;
  sVar145 = auVar115._10_2_;
  auVar156._10_2_ =
       (ushort)((short)uVar147 < sVar145) * sVar145 | ((short)uVar147 >= sVar145) * uVar147;
  sVar2 = auVar115._12_2_;
  auVar156._12_2_ = (ushort)((short)uVar148 < sVar2) * sVar2 | ((short)uVar148 >= sVar2) * uVar148;
  sVar3 = auVar115._14_2_;
  auVar156._14_2_ = (ushort)((short)uVar149 < sVar3) * sVar3 | ((short)uVar149 >= sVar3) * uVar149;
  auVar110 = psubsw(auVar156 >> 0x40 & auVar118,auVar156);
  auVar110 = psubsw(auVar110,auVar156);
  auVar110 = psubsw(auVar110,auVar156);
  auVar165._0_2_ = -(ushort)(auVar164._0_2_ == 0);
  auVar165._2_2_ = -(ushort)(auVar164._2_2_ == 0);
  auVar165._4_2_ = -(ushort)(auVar164._4_2_ == 0);
  auVar165._6_2_ = -(ushort)(auVar164._6_2_ == 0);
  auVar165._8_2_ = -(ushort)(auVar164._8_2_ == 0);
  auVar165._10_2_ = -(ushort)(auVar164._10_2_ == 0);
  auVar165._12_2_ = -(ushort)(auVar164._12_2_ == 0);
  auVar165._14_2_ = -(ushort)(auVar164._14_2_ == 0);
  sVar124 = auVar110._0_2_;
  uVar123 = (ushort)(sVar161 < sVar124) * sVar161 | (ushort)(sVar161 >= sVar124) * sVar124;
  sVar124 = auVar110._2_2_;
  uVar133 = (ushort)(sVar162 < sVar124) * sVar162 | (ushort)(sVar162 >= sVar124) * sVar124;
  sVar124 = auVar110._4_2_;
  uVar137 = (ushort)(sVar4 < sVar124) * sVar4 | (ushort)(sVar4 >= sVar124) * sVar124;
  sVar124 = auVar110._6_2_;
  uVar141 = (ushort)(sVar5 < sVar124) * sVar5 | (ushort)(sVar5 >= sVar124) * sVar124;
  sVar124 = auVar110._8_2_;
  uVar146 = (ushort)(sVar6 < sVar124) * sVar6 | (ushort)(sVar6 >= sVar124) * sVar124;
  sVar124 = auVar110._10_2_;
  uVar147 = (ushort)(sVar7 < sVar124) * sVar7 | (ushort)(sVar7 >= sVar124) * sVar124;
  sVar124 = auVar110._12_2_;
  sVar150 = auVar110._14_2_;
  uVar148 = (ushort)(sVar8 < sVar124) * sVar8 | (ushort)(sVar8 >= sVar124) * sVar124;
  uVar149 = (ushort)(sVar9 < sVar150) * sVar9 | (ushort)(sVar9 >= sVar150) * sVar150;
  auVar129._0_2_ = (ushort)((short)uVar123 < sVar70) * sVar70 | ((short)uVar123 >= sVar70) * uVar123
  ;
  auVar129._2_2_ = (ushort)((short)uVar133 < sVar79) * sVar79 | ((short)uVar133 >= sVar79) * uVar133
  ;
  auVar129._4_2_ = (ushort)((short)uVar137 < sVar80) * sVar80 | ((short)uVar137 >= sVar80) * uVar137
  ;
  auVar129._6_2_ = (ushort)((short)uVar141 < sVar82) * sVar82 | ((short)uVar141 >= sVar82) * uVar141
  ;
  auVar129._8_2_ =
       (ushort)((short)uVar146 < sVar142) * sVar142 | ((short)uVar146 >= sVar142) * uVar146;
  auVar129._10_2_ =
       (ushort)((short)uVar147 < sVar145) * sVar145 | ((short)uVar147 >= sVar145) * uVar147;
  auVar129._12_2_ = (ushort)((short)uVar148 < sVar2) * sVar2 | ((short)uVar148 >= sVar2) * uVar148;
  auVar129._14_2_ = (ushort)((short)uVar149 < sVar3) * sVar3 | ((short)uVar149 >= sVar3) * uVar149;
  auVar129 = auVar129 & auVar165;
  auVar130._0_8_ = auVar129._0_8_;
  auVar130._8_4_ = auVar129._0_4_;
  auVar130._12_4_ = auVar129._4_4_;
  auVar110 = paddsw(auVar130,_DAT_00515e10);
  sVar124 = auVar110._0_2_;
  uVar123 = (ushort)(sVar161 < sVar124) * sVar161 | (ushort)(sVar161 >= sVar124) * sVar124;
  sVar124 = auVar110._2_2_;
  uVar133 = (ushort)(sVar162 < sVar124) * sVar162 | (ushort)(sVar162 >= sVar124) * sVar124;
  sVar124 = auVar110._4_2_;
  uVar137 = (ushort)(sVar4 < sVar124) * sVar4 | (ushort)(sVar4 >= sVar124) * sVar124;
  sVar124 = auVar110._6_2_;
  uVar141 = (ushort)(sVar5 < sVar124) * sVar5 | (ushort)(sVar5 >= sVar124) * sVar124;
  sVar124 = auVar110._8_2_;
  uVar146 = (ushort)(sVar6 < sVar124) * sVar6 | (ushort)(sVar6 >= sVar124) * sVar124;
  sVar124 = auVar110._10_2_;
  uVar147 = (ushort)(sVar7 < sVar124) * sVar7 | (ushort)(sVar7 >= sVar124) * sVar124;
  sVar124 = auVar110._12_2_;
  sVar150 = auVar110._14_2_;
  uVar148 = (ushort)(sVar8 < sVar124) * sVar8 | (ushort)(sVar8 >= sVar124) * sVar124;
  uVar149 = (ushort)(sVar9 < sVar150) * sVar9 | (ushort)(sVar9 >= sVar150) * sVar150;
  auVar131._0_2_ = (ushort)((short)uVar123 < sVar70) * sVar70 | ((short)uVar123 >= sVar70) * uVar123
  ;
  auVar131._2_2_ = (ushort)((short)uVar133 < sVar79) * sVar79 | ((short)uVar133 >= sVar79) * uVar133
  ;
  auVar131._4_2_ = (ushort)((short)uVar137 < sVar80) * sVar80 | ((short)uVar137 >= sVar80) * uVar137
  ;
  auVar131._6_2_ = (ushort)((short)uVar141 < sVar82) * sVar82 | ((short)uVar141 >= sVar82) * uVar141
  ;
  auVar131._8_2_ =
       (ushort)((short)uVar146 < sVar142) * sVar142 | ((short)uVar146 >= sVar142) * uVar146;
  auVar131._10_2_ =
       (ushort)((short)uVar147 < sVar145) * sVar145 | ((short)uVar147 >= sVar145) * uVar147;
  auVar131._12_2_ = (ushort)((short)uVar148 < sVar2) * sVar2 | ((short)uVar148 >= sVar2) * uVar148;
  auVar131._14_2_ = (ushort)((short)uVar149 < sVar3) * sVar3 | ((short)uVar149 >= sVar3) * uVar149;
  auVar110 = psraw(auVar131,3);
  auVar158._0_2_ = auVar110._0_2_ + 1;
  auVar158._2_2_ = auVar110._2_2_ + 1;
  auVar158._4_2_ = auVar110._4_2_ + 1;
  auVar158._6_2_ = auVar110._6_2_ + 1;
  auVar158._8_2_ = auVar110._0_2_ + 1;
  auVar158._10_2_ = auVar110._2_2_ + 1;
  auVar158._12_2_ = auVar110._4_2_ + 1;
  auVar158._14_2_ = auVar110._6_2_ + 1;
  auVar115 = psraw(auVar158,1);
  auVar159._8_8_ = SUB168(~auVar118 & auVar115,8);
  auVar159._0_8_ = auVar110._8_8_;
  auVar132._8_8_ = SUB168(~auVar118 & auVar115,0);
  auVar132._0_8_ = auVar110._0_8_;
  auVar110 = psubsw(auVar127,auVar132);
  auVar75 = paddsw(auVar159,auVar75);
  sVar124 = auVar110._0_2_;
  uVar123 = (ushort)(sVar161 < sVar124) * sVar161 | (ushort)(sVar161 >= sVar124) * sVar124;
  sVar124 = auVar110._2_2_;
  uVar133 = (ushort)(sVar162 < sVar124) * sVar162 | (ushort)(sVar162 >= sVar124) * sVar124;
  sVar124 = auVar110._4_2_;
  uVar137 = (ushort)(sVar4 < sVar124) * sVar4 | (ushort)(sVar4 >= sVar124) * sVar124;
  sVar124 = auVar110._6_2_;
  uVar141 = (ushort)(sVar5 < sVar124) * sVar5 | (ushort)(sVar5 >= sVar124) * sVar124;
  sVar124 = auVar110._8_2_;
  uVar146 = (ushort)(sVar6 < sVar124) * sVar6 | (ushort)(sVar6 >= sVar124) * sVar124;
  sVar124 = auVar110._10_2_;
  uVar147 = (ushort)(sVar7 < sVar124) * sVar7 | (ushort)(sVar7 >= sVar124) * sVar124;
  sVar124 = auVar110._12_2_;
  sVar150 = auVar110._14_2_;
  uVar148 = (ushort)(sVar8 < sVar124) * sVar8 | (ushort)(sVar8 >= sVar124) * sVar124;
  uVar149 = (ushort)(sVar9 < sVar150) * sVar9 | (ushort)(sVar9 >= sVar150) * sVar150;
  auVar155._0_2_ = (ushort)((short)uVar123 < sVar70) * sVar70 | ((short)uVar123 >= sVar70) * uVar123
  ;
  auVar155._2_2_ = (ushort)((short)uVar133 < sVar79) * sVar79 | ((short)uVar133 >= sVar79) * uVar133
  ;
  auVar155._4_2_ = (ushort)((short)uVar137 < sVar80) * sVar80 | ((short)uVar137 >= sVar80) * uVar137
  ;
  auVar155._6_2_ = (ushort)((short)uVar141 < sVar82) * sVar82 | ((short)uVar141 >= sVar82) * uVar141
  ;
  auVar155._8_2_ =
       (ushort)((short)uVar146 < sVar142) * sVar142 | ((short)uVar146 >= sVar142) * uVar146;
  auVar155._10_2_ =
       (ushort)((short)uVar147 < sVar145) * sVar145 | ((short)uVar147 >= sVar145) * uVar147;
  auVar155._12_2_ = (ushort)((short)uVar148 < sVar2) * sVar2 | ((short)uVar148 >= sVar2) * uVar148;
  auVar155._14_2_ = (ushort)((short)uVar149 < sVar3) * sVar3 | ((short)uVar149 >= sVar3) * uVar149;
  sVar124 = auVar75._0_2_;
  uVar123 = (ushort)(sVar161 < sVar124) * sVar161 | (ushort)(sVar161 >= sVar124) * sVar124;
  sVar161 = auVar75._2_2_;
  uVar133 = (ushort)(sVar162 < sVar161) * sVar162 | (ushort)(sVar162 >= sVar161) * sVar161;
  sVar161 = auVar75._4_2_;
  uVar137 = (ushort)(sVar4 < sVar161) * sVar4 | (ushort)(sVar4 >= sVar161) * sVar161;
  sVar161 = auVar75._6_2_;
  uVar141 = (ushort)(sVar5 < sVar161) * sVar5 | (ushort)(sVar5 >= sVar161) * sVar161;
  sVar161 = auVar75._8_2_;
  uVar146 = (ushort)(sVar6 < sVar161) * sVar6 | (ushort)(sVar6 >= sVar161) * sVar161;
  sVar161 = auVar75._10_2_;
  uVar147 = (ushort)(sVar7 < sVar161) * sVar7 | (ushort)(sVar7 >= sVar161) * sVar161;
  sVar161 = auVar75._12_2_;
  sVar162 = auVar75._14_2_;
  uVar148 = (ushort)(sVar8 < sVar161) * sVar8 | (ushort)(sVar8 >= sVar161) * sVar161;
  uVar149 = (ushort)(sVar9 < sVar162) * sVar9 | (ushort)(sVar9 >= sVar162) * sVar162;
  auVar160._0_2_ = (ushort)((short)uVar123 < sVar70) * sVar70 | ((short)uVar123 >= sVar70) * uVar123
  ;
  auVar160._2_2_ = (ushort)((short)uVar133 < sVar79) * sVar79 | ((short)uVar133 >= sVar79) * uVar133
  ;
  auVar160._4_2_ = (ushort)((short)uVar137 < sVar80) * sVar80 | ((short)uVar137 >= sVar80) * uVar137
  ;
  auVar160._6_2_ = (ushort)((short)uVar141 < sVar82) * sVar82 | ((short)uVar141 >= sVar82) * uVar141
  ;
  auVar160._8_2_ =
       (ushort)((short)uVar146 < sVar142) * sVar142 | ((short)uVar146 >= sVar142) * uVar146;
  auVar160._10_2_ =
       (ushort)((short)uVar147 < sVar145) * sVar145 | ((short)uVar147 >= sVar145) * uVar147;
  auVar160._12_2_ = (ushort)((short)uVar148 < sVar2) * sVar2 | ((short)uVar148 >= sVar2) * uVar148;
  auVar160._14_2_ = (ushort)((short)uVar149 < sVar3) * sVar3 | ((short)uVar149 >= sVar3) * uVar149;
  auVar110 = paddsw(auVar155,auVar112);
  auVar75 = paddsw(auVar160,auVar112);
  auVar45._8_4_ = uVar99;
  auVar45._0_8_ = local_98[0];
  auVar45._12_4_ = uVar71;
  auVar47._8_8_ = auVar102._0_8_;
  auVar47._0_8_ = local_78;
  auVar115 = psubusw(auVar47,auVar45);
  auVar154 = psubusw(auVar45,auVar47);
  auVar154 = auVar154 | auVar115;
  auVar46._8_8_ = auVar102._8_8_;
  auVar46._0_8_ = auVar120._0_8_;
  auVar127 = psubusw(auVar46,auVar45);
  auVar115 = psubusw(auVar45,auVar46);
  auVar115 = auVar115 | auVar127;
  sVar70 = auVar154._0_2_;
  sVar79 = auVar115._0_2_;
  uVar123 = (ushort)(sVar79 < sVar70) * sVar70 | (ushort)(sVar79 >= sVar70) * sVar79;
  sVar70 = auVar154._2_2_;
  sVar79 = auVar115._2_2_;
  uVar133 = (ushort)(sVar79 < sVar70) * sVar70 | (ushort)(sVar79 >= sVar70) * sVar79;
  sVar70 = auVar154._4_2_;
  sVar79 = auVar115._4_2_;
  uVar137 = (ushort)(sVar79 < sVar70) * sVar70 | (ushort)(sVar79 >= sVar70) * sVar79;
  sVar70 = auVar154._6_2_;
  sVar79 = auVar115._6_2_;
  uVar141 = (ushort)(sVar79 < sVar70) * sVar70 | (ushort)(sVar79 >= sVar70) * sVar79;
  sVar70 = auVar154._8_2_;
  sVar79 = auVar115._8_2_;
  uVar146 = (ushort)(sVar79 < sVar70) * sVar70 | (ushort)(sVar79 >= sVar70) * sVar79;
  sVar70 = auVar154._10_2_;
  sVar79 = auVar115._10_2_;
  uVar147 = (ushort)(sVar79 < sVar70) * sVar70 | (ushort)(sVar79 >= sVar70) * sVar79;
  sVar70 = auVar154._12_2_;
  sVar79 = auVar115._12_2_;
  sVar80 = auVar115._14_2_;
  uVar148 = (ushort)(sVar79 < sVar70) * sVar70 | (ushort)(sVar79 >= sVar70) * sVar79;
  sVar70 = auVar154._14_2_;
  uVar149 = (ushort)(sVar80 < sVar70) * sVar70 | (ushort)(sVar80 >= sVar70) * sVar80;
  uVar123 = (sVar125 < (short)uVar123) * uVar123 | (ushort)(sVar125 >= (short)uVar123) * sVar125;
  uVar133 = (sVar126 < (short)uVar133) * uVar133 | (ushort)(sVar126 >= (short)uVar133) * sVar126;
  uVar137 = (sVar135 < (short)uVar137) * uVar137 | (ushort)(sVar135 >= (short)uVar137) * sVar135;
  uVar141 = (sVar134 < (short)uVar141) * uVar141 | (ushort)(sVar134 >= (short)uVar141) * sVar134;
  uVar146 = (sVar139 < (short)uVar146) * uVar146 | (ushort)(sVar139 >= (short)uVar146) * sVar139;
  uVar147 = (sVar138 < (short)uVar147) * uVar147 | (ushort)(sVar138 >= (short)uVar147) * sVar138;
  uVar148 = (sVar140 < (short)uVar148) * uVar148 | (ushort)(sVar140 >= (short)uVar148) * sVar140;
  uVar149 = (sVar143 < (short)uVar149) * uVar149 | (ushort)(sVar143 >= (short)uVar149) * sVar143;
  auVar88._0_2_ =
       ((short)uVar146 < (short)uVar123) * uVar123 | ((short)uVar146 >= (short)uVar123) * uVar146;
  auVar88._2_2_ =
       ((short)uVar147 < (short)uVar133) * uVar133 | ((short)uVar147 >= (short)uVar133) * uVar147;
  auVar88._4_2_ =
       ((short)uVar148 < (short)uVar137) * uVar137 | ((short)uVar148 >= (short)uVar137) * uVar148;
  auVar88._6_2_ =
       ((short)uVar149 < (short)uVar141) * uVar141 | ((short)uVar149 >= (short)uVar141) * uVar149;
  auVar88._8_2_ = (0 < (short)uVar146) * uVar146;
  auVar88._10_2_ = (0 < (short)uVar147) * uVar147;
  auVar88._12_2_ = (0 < (short)uVar148) * uVar148;
  auVar88._14_2_ = (0 < (short)uVar149) * uVar149;
  auVar115 = psllw(_DAT_00515e00,auVar152);
  auVar115 = psubusw(auVar88,auVar115);
  auVar89._0_2_ = -(ushort)(auVar115._0_2_ == 0);
  auVar89._2_2_ = -(ushort)(auVar115._2_2_ == 0);
  auVar89._4_2_ = -(ushort)(auVar115._4_2_ == 0);
  auVar89._6_2_ = -(ushort)(auVar115._6_2_ == 0);
  auVar89._8_2_ = -(ushort)(auVar115._8_2_ == 0);
  auVar89._10_2_ = -(ushort)(auVar115._10_2_ == 0);
  auVar89._12_2_ = -(ushort)(auVar115._12_2_ == 0);
  auVar89._14_2_ = -(ushort)(auVar115._14_2_ == 0);
  auVar89 = auVar89 & auVar165;
  auVar90._0_8_ = auVar89._0_8_;
  auVar90._8_4_ = auVar89._0_4_;
  auVar90._12_4_ = auVar89._4_4_;
  auVar157._0_2_ = -(ushort)(auVar89._0_2_ == 0);
  auVar157._2_2_ = -(ushort)(auVar89._2_2_ == 0);
  auVar157._4_2_ = -(ushort)(auVar89._4_2_ == 0);
  auVar157._6_2_ = -(ushort)(auVar89._6_2_ == 0);
  auVar157._8_2_ = -(ushort)(auVar89._0_2_ == 0);
  auVar157._10_2_ = -(ushort)(auVar89._2_2_ == 0);
  auVar157._12_2_ = -(ushort)(auVar89._4_2_ == 0);
  auVar157._14_2_ = -(ushort)(auVar89._6_2_ == 0);
  if ((ushort)((ushort)(SUB161(auVar157 >> 7,0) & 1) | (ushort)(SUB161(auVar157 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar157 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar157 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar157 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar157 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar157 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar157 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar157 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar157 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar157 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar157 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar157 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar157 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar157._14_2_ >> 7) & 1) << 0xe | auVar157._14_2_ & 0x8000) !=
      0xffff) {
    sVar125 = sVar98 + sVar97 + sVar144 + sVar91 * 2 + 4;
    sVar134 = uVar31 + uVar30 + uVar32 + uVar29 * 2 + 4;
    sVar138 = sVar67 + sVar66 + sVar136 + sVar63 * 2 + 4;
    sVar142 = uVar39 + uVar38 + uVar40 + uVar37 * 2 + 4;
    sVar70 = sVar106 + sVar107;
    sVar79 = uVar33 + uVar34;
    sVar80 = sVar83 + sVar84;
    sVar82 = uVar41 + uVar42;
    sVar126 = (sVar125 - sVar91) + sVar108;
    sVar135 = (sVar134 - uVar29) + uVar35;
    sVar139 = (sVar138 - sVar63) + sVar85;
    sVar143 = (sVar142 - uVar37) + uVar43;
    auVar64._0_2_ = (ushort)(sVar144 + sVar70 + sVar126) >> 3;
    auVar64._2_2_ = (ushort)(uVar32 + sVar79 + sVar135) >> 3;
    auVar64._4_2_ = (ushort)(sVar136 + sVar80 + sVar139) >> 3;
    auVar64._6_2_ = (ushort)(uVar40 + sVar82 + sVar143) >> 3;
    auVar64._8_2_ = (ushort)(sVar98 + sVar70 + sVar125) >> 3;
    auVar64._10_2_ = (ushort)(uVar31 + sVar79 + sVar134) >> 3;
    auVar64._12_2_ = (ushort)(sVar67 + sVar80 + sVar138) >> 3;
    auVar64._14_2_ = (ushort)(uVar39 + sVar82 + sVar142) >> 3;
    sVar126 = (sVar126 - sVar91) + sVar109;
    sVar136 = (sVar135 - uVar29) + uVar36;
    sVar140 = (sVar139 - sVar63) + sVar86;
    sVar144 = (sVar143 - uVar37) + uVar44;
    sVar135 = (sVar126 - sVar97) + sVar109;
    sVar139 = (sVar136 - uVar30) + uVar36;
    sVar143 = (sVar140 - sVar66) + sVar86;
    sVar145 = (sVar144 - uVar38) + uVar44;
    auVar68._0_2_ = (ushort)(sVar106 + sVar70 + sVar126) >> 3;
    auVar68._2_2_ = (ushort)(uVar33 + sVar79 + sVar136) >> 3;
    auVar68._4_2_ = (ushort)(sVar83 + sVar80 + sVar140) >> 3;
    auVar68._6_2_ = (ushort)(uVar41 + sVar82 + sVar144) >> 3;
    auVar68._8_2_ = (ushort)(sVar107 + sVar70 + sVar135) >> 3;
    auVar68._10_2_ = (ushort)(uVar34 + sVar79 + sVar139) >> 3;
    auVar68._12_2_ = (ushort)(sVar84 + sVar80 + sVar143) >> 3;
    auVar68._14_2_ = (ushort)(uVar42 + sVar82 + sVar145) >> 3;
    auVar113._0_2_ = (ushort)(sVar106 + sVar97 + sVar91 + sVar125) >> 3;
    auVar113._2_2_ = (ushort)(uVar33 + uVar30 + uVar29 + sVar134) >> 3;
    auVar113._4_2_ = (ushort)(sVar83 + sVar66 + sVar63 + sVar138) >> 3;
    auVar113._6_2_ = (ushort)(uVar41 + uVar38 + uVar37 + sVar142) >> 3;
    auVar113._8_2_ = (ushort)((sVar108 - sVar98) + sVar109 + sVar70 + sVar135) >> 3;
    auVar113._10_2_ = (ushort)((uVar35 - uVar31) + uVar36 + sVar79 + sVar139) >> 3;
    auVar113._12_2_ = (ushort)((sVar85 - sVar67) + sVar86 + sVar80 + sVar143) >> 3;
    auVar113._14_2_ = (ushort)((uVar43 - uVar39) + uVar44 + sVar82 + sVar145) >> 3;
    auVar69 = auVar68 & auVar90 | ~auVar90 & auVar110;
    auVar75 = auVar64 & auVar90 | ~auVar90 & auVar75;
    auVar110 = auVar113 & auVar90 | ~auVar90 & auVar47;
    local_78 = auVar110._0_8_;
    auVar102._0_8_ = auVar110._8_8_;
    auVar110 = auVar69;
  }
  auVar122._8_4_ = 0;
  auVar122._0_8_ = auVar120._0_8_;
  auVar122._12_2_ = uVar37;
  auVar122._14_2_ = (short)((ulong)local_78 >> 0x30);
  auVar121._12_4_ = auVar122._12_4_;
  auVar121._8_2_ = 0;
  auVar121._0_8_ = auVar120._0_8_;
  auVar121._10_2_ = (short)((ulong)local_78 >> 0x20);
  auVar120._10_6_ = auVar121._10_6_;
  auVar120._8_2_ = sVar63;
  auVar53._4_8_ = auVar120._8_8_;
  auVar53._2_2_ = (short)((ulong)local_78 >> 0x10);
  auVar53._0_2_ = uVar29;
  auVar119._0_4_ = CONCAT22((short)local_78,sVar91);
  auVar119._4_12_ = auVar53;
  auVar65._4_4_ = auVar75._8_4_;
  auVar65._0_4_ = auVar75._0_4_;
  auVar65._8_4_ = auVar75._4_4_;
  auVar65._12_4_ = auVar75._12_4_;
  auVar115 = pshufhw(auVar69,auVar65,0x72);
  auVar75 = pshuflw(auVar65,auVar65,0x72);
  auVar77._4_4_ = auVar110._8_4_;
  auVar77._0_4_ = auVar110._0_4_;
  auVar77._8_4_ = auVar110._4_4_;
  auVar77._12_4_ = auVar110._12_4_;
  auVar127 = pshufhw(auVar90,auVar77,0xd8);
  auVar110 = pshuflw(auVar77,auVar77,0xd8);
  auVar105._8_4_ = 0;
  auVar105._0_8_ = auVar102._0_8_;
  auVar105._12_2_ = (short)(auVar102._0_8_ >> 0x30);
  auVar105._14_2_ = uVar44;
  auVar104._12_4_ = auVar105._12_4_;
  auVar104._8_2_ = 0;
  auVar104._0_8_ = auVar102._0_8_;
  auVar104._10_2_ = sVar86;
  auVar103._10_6_ = auVar104._10_6_;
  auVar103._8_2_ = (short)(auVar102._0_8_ >> 0x20);
  auVar103._0_8_ = auVar102._0_8_;
  auVar54._4_8_ = auVar103._8_8_;
  auVar54._2_2_ = uVar36;
  auVar54._0_2_ = (short)(auVar102._0_8_ >> 0x10);
  auVar96._0_8_ = auVar119._0_8_;
  auVar96._8_4_ = auVar53._0_4_;
  auVar96._12_4_ = auVar75._4_4_;
  auVar78._0_8_ = auVar110._0_8_;
  auVar78._8_4_ = auVar110._4_4_;
  auVar78._12_4_ = auVar54._0_4_;
  *(ulong *)(s + -4) = CONCAT44(auVar75._0_4_,auVar119._0_4_);
  *(ulong *)s = CONCAT44(CONCAT22(sVar109,(short)auVar102._0_8_),auVar110._0_4_);
  *(long *)(s + (long)p + -4) = auVar96._8_8_;
  *(long *)(s + (long)p + -4 + 4) = auVar78._8_8_;
  puVar1 = s + (long)(p * 2) + -4;
  *(int *)puVar1 = auVar120._8_4_;
  *(int *)(puVar1 + 2) = auVar115._8_4_;
  *(int *)(puVar1 + 4) = auVar127._8_4_;
  *(int *)(puVar1 + 6) = auVar103._8_4_;
  *(undefined4 *)(s + lVar62) = auVar121._12_4_;
  *(int *)(s + lVar62 + 2) = auVar115._12_4_;
  *(int *)(s + lVar62 + 4) = auVar127._12_4_;
  *(undefined4 *)(s + lVar62 + 6) = auVar104._12_4_;
  return;
}

Assistant:

void aom_highbd_lpf_vertical_8_sse2(uint16_t *s, int p, const uint8_t *blimit,
                                    const uint8_t *limit, const uint8_t *thresh,
                                    int bd) {
  __m128i d0, d1, d2, d3, d4, d5, d6, d7;
  __m128i p2, p1, p0, p3, q0;
  __m128i q1q0, p1p0;

  p3 = _mm_loadu_si128((__m128i *)((s - 4) + 0 * p));
  p2 = _mm_loadu_si128((__m128i *)((s - 4) + 1 * p));
  p1 = _mm_loadu_si128((__m128i *)((s - 4) + 2 * p));
  p0 = _mm_loadu_si128((__m128i *)((s - 4) + 3 * p));

  highbd_transpose4x8_8x4_sse2(&p3, &p2, &p1, &p0, &d0, &d1, &d2, &d3, &d4, &d5,
                               &d6, &d7);

  // Loop filtering
  highbd_lpf_internal_8_sse2(&d0, &d7, &d1, &d6, &d2, &d5, &d3, &d4, &q1q0,
                             &p1p0, blimit, limit, thresh, bd);

  p0 = _mm_srli_si128(p1p0, 8);
  q0 = _mm_srli_si128(q1q0, 8);

  highbd_transpose8x8_low_sse2(&d0, &d1, &p0, &p1p0, &q1q0, &q0, &d6, &d7, &d0,
                               &d1, &d2, &d3);

  _mm_storeu_si128((__m128i *)(s - 4 + 0 * p), d0);
  _mm_storeu_si128((__m128i *)(s - 4 + 1 * p), d1);
  _mm_storeu_si128((__m128i *)(s - 4 + 2 * p), d2);
  _mm_storeu_si128((__m128i *)(s - 4 + 3 * p), d3);
}